

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Matrix<double,_3,_2> * __thiscall
gl4cts::Math::outerProduct<2,3>
          (Matrix<double,_3,_2> *__return_storage_ptr__,Math *this,Vector<double,_3> *left,
          Vector<double,_2> *right)

{
  Vector<double,_3> *pVVar1;
  int row;
  long lVar2;
  undefined1 auVar3 [16];
  bool bVar5;
  double dVar6;
  Matrix<double,_3,_1> local_68;
  Matrix<double,_1,_2> local_48;
  double local_38 [6];
  long lVar4;
  
  lVar2 = 0;
  auVar3 = _DAT_019f34d0;
  do {
    bVar5 = SUB164(auVar3 ^ _DAT_019ec5b0,4) == -0x80000000 &&
            SUB164(auVar3 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
    if (bVar5) {
      dVar6 = 1.0;
      if (lVar2 != 0) {
        dVar6 = 0.0;
      }
      local_68.m_data.m_data[0].m_data[lVar2] = dVar6;
    }
    if (bVar5) {
      local_68.m_data.m_data[0].m_data[lVar2 + 1] = 0.0;
    }
    lVar2 = lVar2 + 2;
    lVar4 = auVar3._8_8_;
    auVar3._0_8_ = auVar3._0_8_ + 2;
    auVar3._8_8_ = lVar4 + 2;
  } while (lVar2 != 4);
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[1] = 0.0;
  pVVar1[1].m_data[2] = 0.0;
  *(undefined1 (*) [16])((__return_storage_ptr__->m_data).m_data[0].m_data + 2) =
       (undefined1  [16])0x0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  lVar2 = 0;
  do {
    dVar6 = 1.0;
    if (lVar2 != 0) {
      dVar6 = 0.0;
    }
    (__return_storage_ptr__->m_data).m_data[0].m_data[lVar2] = dVar6;
    dVar6 = 1.0;
    if (lVar2 != 1) {
      dVar6 = 0.0;
    }
    (__return_storage_ptr__->m_data).m_data[1].m_data[lVar2] = dVar6;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_68.m_data.m_data[0].m_data[2] = *(double *)(this + 0x10);
  local_68.m_data.m_data[0].m_data[0] = *(double *)this;
  local_68.m_data.m_data[0].m_data[1] = *(double *)(this + 8);
  local_48.m_data.m_data[0].m_data[0] = (double  [1])left->m_data[0];
  local_48.m_data.m_data[1].m_data[0] = (double  [1])left->m_data[1];
  tcu::operator*(&local_68,&local_48);
  lVar2 = 0;
  do {
    (__return_storage_ptr__->m_data).m_data[0].m_data[lVar2] = local_38[lVar2];
    (__return_storage_ptr__->m_data).m_data[1].m_data[lVar2] = local_38[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Rows, Cols> outerProduct(const tcu::Vector<glw::GLdouble, Rows>& left,
														   const tcu::Vector<glw::GLdouble, Cols>& right)
{
	tcu::Matrix<glw::GLdouble, Rows, 1>	left_mat;
	tcu::Matrix<glw::GLdouble, 1, Cols>	right_mat;
	tcu::Matrix<glw::GLdouble, Rows, Cols> result;

	for (glw::GLuint i = 0; i < Rows; ++i)
	{
		left_mat(i, 0) = left[i];
	}

	for (glw::GLuint i = 0; i < Cols; ++i)
	{
		right_mat(0, i) = right[i];
	}

	result = left_mat * right_mat;

	return result;
}